

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O1

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
::~AndParamConstraint
          (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->cons2_).super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
           description_._M_dataplus._M_p;
  paVar2 = &(this->cons2_).super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>
            .description_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->cons1_).super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
           description_._M_dataplus._M_p;
  paVar2 = &(this->cons1_).super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
            description_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
           ).description_._M_dataplus._M_p;
  paVar2 = &(this->
            super_ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
            ).description_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }